

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int mpipe(int *fds)

{
  int iVar1;
  int *fds_local;
  
  iVar1 = pipe(fds);
  if (iVar1 != -1) {
    iVar1 = fcntl64(*fds,2,1);
    if ((iVar1 != -1) && (iVar1 = fcntl64(fds[1],2,1), iVar1 != -1)) {
      return 0;
    }
    close(*fds);
    close(fds[1]);
  }
  return -1;
}

Assistant:

static int mpipe(int *fds) {
  if (pipe(fds) == -1)
    return -1;
  if (fcntl(fds[0], F_SETFD, FD_CLOEXEC) == -1 ||
      fcntl(fds[1], F_SETFD, FD_CLOEXEC) == -1) {
    close(fds[0]);
    close(fds[1]);
    return -1;
  }
  return 0;
}